

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O1

vector<std::shared_ptr<const_helics::SmallBuffer>,_std::allocator<std::shared_ptr<const_helics::SmallBuffer>_>_>
* __thiscall helics::CommonCore::getAllValues(CommonCore *this,InterfaceHandle handle)

{
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *ppVar1;
  FederateState *this_00;
  vector<std::shared_ptr<const_helics::SmallBuffer>,_std::allocator<std::shared_ptr<const_helics::SmallBuffer>_>_>
  *pvVar2;
  InvalidIdentifier *this_01;
  char *pcVar3;
  size_t sVar4;
  string_view message;
  
  ppVar1 = getHandleInfo(this,handle);
  if (ppVar1 == (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)0x0) {
    this_01 = (InvalidIdentifier *)__cxa_allocate_exception(0x28);
    pcVar3 = "Handle is invalid (getValue)";
    sVar4 = 0x1c;
  }
  else {
    if (*(char *)((long)&(ppVar1->first)._M_string_length + 4) == 'i') {
      this_00 = getFederateAt(this,(LocalFederateId)(BaseType)(ppVar1->first)._M_string_length);
      FederateState::sleeplock(this_00);
      pvVar2 = FederateState::getAllValues(this_00,handle);
      LOCK();
      (this_00->processing).super___atomic_flag_base._M_i = false;
      UNLOCK();
      return pvVar2;
    }
    this_01 = (InvalidIdentifier *)__cxa_allocate_exception(0x28);
    pcVar3 = "Handle does not identify an input";
    sVar4 = 0x21;
  }
  message._M_str = pcVar3;
  message._M_len = sVar4;
  InvalidIdentifier::InvalidIdentifier(this_01,message);
  __cxa_throw(this_01,&InvalidIdentifier::typeinfo,HelicsException::~HelicsException);
}

Assistant:

const std::vector<std::shared_ptr<const SmallBuffer>>&
    CommonCore::getAllValues(InterfaceHandle handle)
{
    const auto* handleInfo = getHandleInfo(handle);
    if (handleInfo == nullptr) {
        throw(InvalidIdentifier("Handle is invalid (getValue)"));
    }

    if (handleInfo->handleType != InterfaceType::INPUT) {
        throw(InvalidIdentifier("Handle does not identify an input"));
    }
    auto& fed = *getFederateAt(handleInfo->local_fed_id);
    const std::lock_guard<FederateState> lock(fed);
    return fed.getAllValues(handle);
}